

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

QModelIndex * __thiscall QCompletionModel::mapToSource(QCompletionModel *this,QModelIndex *index)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QCompletionEngine *pQVar4;
  arrow_operator_result ppQVar5;
  QModelIndex *in_RDX;
  long in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QIndexMapper *rootIndices;
  int row;
  QCompletionModelPrivate *d;
  QModelIndex parent;
  QCompletionEngine *in_stack_ffffffffffffff60;
  QAbstractItemModel *pQVar6;
  int in_stack_ffffffffffffff6c;
  QIndexMapper *in_stack_ffffffffffffff70;
  QIndexMapper *this_00;
  int local_54;
  undefined1 *local_38;
  quintptr local_30;
  QAbstractItemModel *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  QAbstractItemModel *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QCompletionModel *)0xa690ff);
  bVar1 = QModelIndex::isValid((QModelIndex *)in_stack_ffffffffffffff60);
  if (bVar1) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>::
             operator->((QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>
                         *)(in_RSI + 0x18));
    local_20 = *(undefined1 **)&pQVar4->curParent;
    local_18 = (undefined1 *)(pQVar4->curParent).i;
    local_10 = (pQVar4->curParent).m.ptr;
    if ((*(byte *)(in_RSI + 0x20) & 1) == 0) {
      QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>::operator->
                ((QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_> *)
                 (in_RSI + 0x18));
      iVar2 = QCompletionEngine::matchCount(in_stack_ffffffffffffff60);
      if (iVar2 == 0) {
        QModelIndex::QModelIndex((QModelIndex *)0xa691f4);
        goto LAB_00a69337;
      }
      QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>::operator->
                ((QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_> *)
                 (in_RSI + 0x18));
      iVar2 = QModelIndex::row(in_RDX);
      iVar3 = QIndexMapper::count((QIndexMapper *)in_stack_ffffffffffffff60);
      if (iVar2 < iVar3) {
        QModelIndex::row(in_RDX);
        local_54 = QIndexMapper::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        QModelIndex::QModelIndex((QModelIndex *)0xa6926f);
        local_20 = local_38;
        local_18 = (undefined1 *)local_30;
        local_10 = local_28;
      }
      else {
        pQVar4 = QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>::
                 operator->((QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>
                             *)(in_RSI + 0x18));
        this_00 = &(pQVar4->curMatch).indices;
        iVar2 = QModelIndex::row(in_RDX);
        QIndexMapper::count((QIndexMapper *)in_stack_ffffffffffffff60);
        local_54 = QIndexMapper::operator[](this_00,iVar2);
      }
    }
    else {
      local_54 = QModelIndex::row(in_RDX);
    }
    ppQVar5 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
              ::operator->((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                            *)in_stack_ffffffffffffff60);
    pQVar6 = *ppQVar5;
    iVar2 = QModelIndex::column(in_RDX);
    (**(code **)(*(long *)pQVar6 + 0x60))(in_RDI,pQVar6,local_54,iVar2,&local_20);
  }
  else {
    pQVar4 = QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>::
             operator->((QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>
                         *)(in_RSI + 0x18));
    iVar2 = (pQVar4->curParent).c;
    in_RDI->r = (pQVar4->curParent).r;
    in_RDI->c = iVar2;
    in_RDI->i = (pQVar4->curParent).i;
    (in_RDI->m).ptr = (pQVar4->curParent).m.ptr;
  }
LAB_00a69337:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QModelIndex QCompletionModel::mapToSource(const QModelIndex& index) const
{
    Q_D(const QCompletionModel);
    if (!index.isValid())
        return engine->curParent;

    int row;
    QModelIndex parent = engine->curParent;
    if (!showAll) {
        if (!engine->matchCount())
            return QModelIndex();
        Q_ASSERT(index.row() < engine->matchCount());
        QIndexMapper& rootIndices = engine->historyMatch.indices;
        if (index.row() < rootIndices.count()) {
            row = rootIndices[index.row()];
            parent = QModelIndex();
        } else {
            row = engine->curMatch.indices[index.row() - rootIndices.count()];
        }
    } else {
        row = index.row();
    }

    return d->model->index(row, index.column(), parent);
}